

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bus.c
# Opt level: O2

int bus0_sock_set_send_buf_len(void *arg,void *buf,size_t sz,nni_type t)

{
  int iVar1;
  void *item;
  int local_2c [2];
  int val;
  
  iVar1 = nni_copyin_int(local_2c,buf,sz,1,0x2000,t);
  if (iVar1 == 0) {
    nni_mtx_lock((nni_mtx *)((long)arg + 0x18));
    *(int *)((long)arg + 0xc0) = local_2c[0];
    for (item = nni_list_first((nni_list *)arg); item != (void *)0x0;
        item = nni_list_next((nni_list *)arg,item)) {
      iVar1 = nni_lmq_resize((nni_lmq *)((long)item + 0x10),(long)local_2c[0]);
      if (iVar1 != 0) goto LAB_0011c308;
    }
    iVar1 = 0;
LAB_0011c308:
    nni_mtx_unlock((nni_mtx *)((long)arg + 0x18));
  }
  return iVar1;
}

Assistant:

static int
bus0_sock_set_send_buf_len(void *arg, const void *buf, size_t sz, nni_type t)
{
	bus0_sock *s = arg;
	bus0_pipe *p;
	int        val;
	int        rv;

	if ((rv = nni_copyin_int(&val, buf, sz, 1, 8192, t)) != 0) {
		return (rv);
	}

	nni_mtx_lock(&s->mtx);
	s->send_buf = val;
	NNI_LIST_FOREACH (&s->pipes, p) {
		// If we fail part way through (should only be ENOMEM), we
		// stop short.  The others would likely fail for ENOMEM as
		// well anyway.  There is a weird effect here where the
		// buffers may have been set for *some* of the pipes, but
		// we have no way to correct partial failure.
		if ((rv = nni_lmq_resize(&p->send_queue, (size_t) val)) != 0) {
			break;
		}
	}
	nni_mtx_unlock(&s->mtx);
	return (rv);
}